

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O1

void __thiscall
ASDCP::MXF::OPAtomIndexFooter::OPAtomIndexFooter(OPAtomIndexFooter *this,Dictionary *d)

{
  Partition::Partition(&this->super_Partition,d);
  (this->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__OPAtomIndexFooter_00224118;
  Kumu::ByteString::ByteString(&this->m_FooterData);
  this->m_CurrentSegment = (IndexTableSegment *)0x0;
  this->m_BytesPerEditUnit = 0;
  (this->m_EditRate).super_Rational.Numerator = 0;
  (this->m_EditRate).super_Rational.Denominator = 0;
  (this->m_EditRate).super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_002244f8;
  this->m_BodySID = 0;
  (this->m_DefaultDeltaEntry).super_IArchive._vptr_IArchive = (_func_int **)&PTR__IArchive_00224a98;
  (this->m_DefaultDeltaEntry).PosTableIndex = '\0';
  (this->m_DefaultDeltaEntry).Slice = '\0';
  (this->super_Partition).BodySID = 0;
  *(undefined8 *)&(this->m_DefaultDeltaEntry).ElementData = 0;
  *(undefined8 *)((long)&this->m_ECOffset + 4) = 0;
  *(undefined4 *)((long)&this->m_Lookup + 4) = 0;
  (this->super_Partition).IndexSID = 0x81;
  return;
}

Assistant:

ASDCP::MXF::OPAtomIndexFooter::OPAtomIndexFooter(const Dictionary* d) :
  Partition(d),
  m_CurrentSegment(0), m_BytesPerEditUnit(0), m_BodySID(0),
  m_ECOffset(0), m_Lookup(0)
{
  BodySID = 0;
  IndexSID = 129;
}